

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

string * __thiscall
cmLocalGenerator::GetIncludeFlags
          (string *__return_storage_ptr__,cmLocalGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *includeDirs,cmGeneratorTarget *target,string *lang,bool forceFullPaths,
          bool forResponseFile,string *config)

{
  cmMakefile *pcVar1;
  pointer pcVar2;
  size_type sVar3;
  byte bVar4;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_havogt[P]cmakels_cmakels_external_cmake_Source_cmLocalGenerator_cxx:228:5)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_havogt[P]cmakels_cmakels_external_cmake_Source_cmLocalGenerator_cxx:228:5)>
  __comp_00;
  bool bVar5;
  pointer __last;
  bool bVar6;
  bool bVar7;
  long lVar8;
  char *pcVar9;
  size_t sVar10;
  ostream *poVar11;
  pointer pbVar12;
  undefined3 in_register_00000089;
  char *pcVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar17;
  string includePath;
  string flagVar;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  string sysFwSearchFlagVar;
  string fwSearchFlagVar;
  string sysFlagVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  ostringstream includeFlags;
  string local_330;
  cmLocalGenerator *local_310;
  char *local_308;
  cmGeneratorTarget *local_300;
  char *local_2f8;
  undefined4 local_2ec;
  string local_2e8;
  string local_2c8;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 local_290 [8];
  undefined1 auStack_288 [24];
  _Base_ptr local_270;
  size_t local_268;
  string local_260;
  string local_240;
  string local_220;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  string local_1e8;
  string *local_1c8;
  string *local_1c0;
  cmOutputConverter *local_1b8;
  string *local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_2ec = CONCAT31(in_register_00000089,forceFullPaths);
  if (lang->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_200,includeDirs);
    __last = local_200.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar12 = local_200.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_2e8._M_dataplus._M_p = (pointer)target;
    if (target != (cmGeneratorTarget *)0x0) {
      local_290 = (undefined1  [8])&local_2e8;
      auStack_288._0_8_ = config;
      auStack_288._8_8_ = lang;
      if (local_200.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_200.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        lVar8 = (long)local_200.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_200.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
        std::
        _Temporary_buffer<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_1a8,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )local_200.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                            (lVar8 - (lVar8 + 1 >> 0x3f)) + 1 >> 1);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8._16_8_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          __comp_00._M_comp.config = (string *)auStack_288._0_8_;
          __comp_00._M_comp.target = (cmGeneratorTarget **)local_290;
          __comp_00._M_comp.lang = (string *)auStack_288._8_8_;
          std::
          __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<MoveSystemIncludesToEnd(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget_const*)::__0>>
                    ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )pbVar12,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )__last,__comp_00);
        }
        else {
          __comp._M_comp.config = (string *)auStack_288._0_8_;
          __comp._M_comp.target = (cmGeneratorTarget **)local_290;
          __comp._M_comp.lang = (string *)auStack_288._8_8_;
          std::
          __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string*,long,__gnu_cxx::__ops::_Iter_comp_iter<MoveSystemIncludesToEnd(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget_const*)::__0>>
                    ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )pbVar12,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )__last,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_1a8._16_8_,local_1a8._8_8_,__comp);
        }
        std::
        _Temporary_buffer<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~_Temporary_buffer
                  ((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1a8);
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"CMAKE_INCLUDE_FLAG_","");
    std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)(lang->_M_dataplus)._M_p);
    local_1c0 = cmMakefile::GetSafeDefinition(this->Makefile,&local_2e8);
    std::__cxx11::string::_M_replace
              ((ulong)&local_2e8,0,(char *)local_2e8._M_string_length,0x543553);
    std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)(lang->_M_dataplus)._M_p);
    local_2f8 = cmMakefile::GetDefinition(this->Makefile,&local_2e8);
    pcVar1 = this->Makefile;
    local_290 = (undefined1  [8])(auStack_288 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_290,"CMAKE_QUOTE_INCLUDE_PATHS","");
    local_298 = cmMakefile::GetDefinition(pcVar1,(string *)local_290);
    if (local_290 != (undefined1  [8])(auStack_288 + 8)) {
      operator_delete((void *)local_290,(ulong)(auStack_288._8_8_ + 1));
    }
    local_2a0 = " ";
    if (local_2f8 != (char *)0x0) {
      local_2a0 = local_2f8;
    }
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_220,"CMAKE_INCLUDE_SYSTEM_FLAG_","");
    std::__cxx11::string::_M_append((char *)&local_220,(ulong)(lang->_M_dataplus)._M_p);
    if (local_2f8 == (char *)0x0) {
      local_308 = cmMakefile::GetDefinition(this->Makefile,&local_220);
    }
    else {
      local_308 = (char *)0x0;
    }
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"CMAKE_","");
    local_300 = target;
    std::__cxx11::string::_M_append((char *)&local_240,(ulong)(lang->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_240);
    local_310 = this;
    pcVar9 = cmMakefile::GetDefinition(this->Makefile,&local_240);
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"CMAKE_","");
    local_1c8 = __return_storage_ptr__;
    std::__cxx11::string::_M_append((char *)&local_260,(ulong)(lang->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_260);
    local_2a8 = cmMakefile::GetDefinition(local_310->Makefile,&local_260);
    auStack_288._16_8_ = auStack_288;
    auStack_288._0_8_ = auStack_288._0_8_ & 0xffffffff00000000;
    auStack_288._8_8_ = 0;
    local_268 = 0;
    local_1b0 = local_200.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    local_270 = (_Base_ptr)auStack_288._16_8_;
    if (local_200.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_200.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar14 = local_308 != (char *)0x0;
      bVar15 = local_300 != (cmGeneratorTarget *)0x0;
      bVar16 = local_2a8 == (char *)0x0;
      local_1b8 = &local_310->super_cmOutputConverter;
      bVar4 = 0;
      pbVar12 = local_200.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        if ((pcVar9 == (char *)0x0) || (*pcVar9 == '\0')) {
          bVar7 = false;
LAB_003413c0:
          bVar5 = bVar7;
          bVar7 = false;
        }
        else {
          pcVar1 = local_310->Makefile;
          local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"APPLE","");
          bVar6 = cmMakefile::IsOn(pcVar1,&local_1e8);
          bVar5 = true;
          bVar7 = true;
          if (!bVar6) goto LAB_003413c0;
          bVar7 = cmSystemTools::IsPathToFramework(pbVar12);
        }
        if ((bVar5) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2)) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        if (bVar7 == false) {
          if (!(bool)(local_2f8 != (char *)0x0 & bVar4)) {
            if (bVar14 && bVar15) {
              bVar7 = cmGeneratorTarget::IsSystemIncludeDirectory(local_300,pbVar12,config,lang);
              pcVar13 = local_308;
              if (bVar7) {
                sVar10 = strlen(local_308);
                bVar4 = 1;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,pcVar13,sVar10);
                goto LAB_00341566;
              }
            }
            bVar4 = 1;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,(local_1c0->_M_dataplus)._M_p,
                       local_1c0->_M_string_length);
          }
LAB_00341566:
          (*local_310->_vptr_cmLocalGenerator[9])
                    (&local_330,local_310,pbVar12,(ulong)((uint)forResponseFile * 2),
                     (ulong)(byte)local_2ec);
          if (((local_298 != (char *)0x0) && (local_330._M_string_length != 0)) &&
             (*local_330._M_dataplus._M_p != '\"')) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,local_330._M_dataplus._M_p,local_330._M_string_length);
          if (((local_298 != (char *)0x0) && (local_330._M_string_length != 0)) &&
             (*local_330._M_dataplus._M_p != '\"')) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
          }
          pcVar13 = local_2a0;
          sVar10 = strlen(local_2a0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar13,sVar10);
        }
        else {
          local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
          pcVar2 = (pbVar12->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_330,pcVar2,pcVar2 + pbVar12->_M_string_length);
          std::__cxx11::string::append((char *)&local_330);
          cmsys::SystemTools::CollapseFullPath(&local_2c8,&local_330);
          std::__cxx11::string::operator=((string *)&local_330,(string *)&local_2c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
            operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
          }
          pVar17 = std::
                   _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   ::_M_insert_unique<std::__cxx11::string_const&>
                             ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                               *)local_290,&local_330);
          if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            pcVar13 = pcVar9;
            if (bVar16 || !bVar15) {
              if (pcVar9 != (char *)0x0) goto LAB_00341638;
LAB_003414c0:
              std::ios::clear((int)(&stack0xfffffffffffffc98 +
                                   (long)*(_func_int **)(local_1a8._0_8_ + -0x18)) + 0x1c0);
            }
            else {
              bVar7 = cmGeneratorTarget::IsSystemIncludeDirectory(local_300,pbVar12,config,lang);
              if (bVar7) {
                pcVar13 = local_2a8;
              }
              if (pcVar9 == (char *)0x0 && !bVar7) goto LAB_003414c0;
LAB_00341638:
              sVar10 = strlen(pcVar13);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,pcVar13,sVar10);
            }
            cmOutputConverter::ConvertToOutputFormat
                      (&local_2c8,local_1b8,&local_330,(uint)forResponseFile * 2);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,local_2c8._M_dataplus._M_p,
                                 local_2c8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
              operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_dataplus._M_p != &local_330.field_2) {
          operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
        }
        pbVar12 = pbVar12 + 1;
      } while (pbVar12 != local_1b0);
    }
    __return_storage_ptr__ = local_1c8;
    std::__cxx11::stringbuf::str();
    if (((*local_2a0 != ' ') && (sVar3 = __return_storage_ptr__->_M_string_length, sVar3 != 0)) &&
       (pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p, pcVar2[sVar3 - 1] == *local_2a0)) {
      pcVar2[sVar3 - 1] = ' ';
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_200);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::GetIncludeFlags(
  const std::vector<std::string>& includeDirs, cmGeneratorTarget* target,
  const std::string& lang, bool forceFullPaths, bool forResponseFile,
  const std::string& config)
{
  if (lang.empty()) {
    return "";
  }

  std::vector<std::string> includes = includeDirs;
  MoveSystemIncludesToEnd(includes, config, lang, target);

  OutputFormat shellFormat = forResponseFile ? RESPONSE : SHELL;
  std::ostringstream includeFlags;

  std::string flagVar = "CMAKE_INCLUDE_FLAG_";
  flagVar += lang;
  std::string const& includeFlag = this->Makefile->GetSafeDefinition(flagVar);
  flagVar = "CMAKE_INCLUDE_FLAG_SEP_";
  flagVar += lang;
  const char* sep = this->Makefile->GetDefinition(flagVar);
  bool quotePaths = false;
  if (this->Makefile->GetDefinition("CMAKE_QUOTE_INCLUDE_PATHS")) {
    quotePaths = true;
  }
  bool repeatFlag = true;
  // should the include flag be repeated like ie. -IA -IB
  if (!sep) {
    sep = " ";
  } else {
    // if there is a separator then the flag is not repeated but is only
    // given once i.e.  -classpath a:b:c
    repeatFlag = false;
  }

  // Support special system include flag if it is available and the
  // normal flag is repeated for each directory.
  std::string sysFlagVar = "CMAKE_INCLUDE_SYSTEM_FLAG_";
  sysFlagVar += lang;
  const char* sysIncludeFlag = nullptr;
  if (repeatFlag) {
    sysIncludeFlag = this->Makefile->GetDefinition(sysFlagVar);
  }

  std::string fwSearchFlagVar = "CMAKE_";
  fwSearchFlagVar += lang;
  fwSearchFlagVar += "_FRAMEWORK_SEARCH_FLAG";
  const char* fwSearchFlag = this->Makefile->GetDefinition(fwSearchFlagVar);

  std::string sysFwSearchFlagVar = "CMAKE_";
  sysFwSearchFlagVar += lang;
  sysFwSearchFlagVar += "_SYSTEM_FRAMEWORK_SEARCH_FLAG";
  const char* sysFwSearchFlag =
    this->Makefile->GetDefinition(sysFwSearchFlagVar);

  bool flagUsed = false;
  std::set<std::string> emitted;
#ifdef __APPLE__
  emitted.insert("/System/Library/Frameworks");
#endif
  for (std::string const& i : includes) {
    if (fwSearchFlag && *fwSearchFlag && this->Makefile->IsOn("APPLE") &&
        cmSystemTools::IsPathToFramework(i)) {
      std::string frameworkDir = i;
      frameworkDir += "/../";
      frameworkDir = cmSystemTools::CollapseFullPath(frameworkDir);
      if (emitted.insert(frameworkDir).second) {
        if (sysFwSearchFlag && target &&
            target->IsSystemIncludeDirectory(i, config, lang)) {
          includeFlags << sysFwSearchFlag;
        } else {
          includeFlags << fwSearchFlag;
        }
        includeFlags << this->ConvertToOutputFormat(frameworkDir, shellFormat)
                     << " ";
      }
      continue;
    }

    if (!flagUsed || repeatFlag) {
      if (sysIncludeFlag && target &&
          target->IsSystemIncludeDirectory(i, config, lang)) {
        includeFlags << sysIncludeFlag;
      } else {
        includeFlags << includeFlag;
      }
      flagUsed = true;
    }
    std::string includePath =
      this->ConvertToIncludeReference(i, shellFormat, forceFullPaths);
    if (quotePaths && !includePath.empty() && includePath.front() != '\"') {
      includeFlags << "\"";
    }
    includeFlags << includePath;
    if (quotePaths && !includePath.empty() && includePath.front() != '\"') {
      includeFlags << "\"";
    }
    includeFlags << sep;
  }
  std::string flags = includeFlags.str();
  // remove trailing separators
  if ((sep[0] != ' ') && !flags.empty() && flags.back() == sep[0]) {
    flags.back() = ' ';
  }
  return flags;
}